

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

char * __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::
AllocDecommitPages<BVStatic<272ul>,false>
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,uint pageCount,
          BVStatic<272UL> freePages,BVStatic<272UL> decommitPages)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *pPVar8;
  PreReservedVirtualAllocWrapper *this_00;
  ulong pageCount_00;
  char *pcVar9;
  uint newFreePageCount;
  void *ret;
  char *pcStack_58;
  uint nextIndex;
  char *pages;
  uint index;
  uint oldFreePageCount;
  BVStatic<272UL> freeAndDecommitPages;
  uint pageCount_local;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  uVar6 = this->freePageCount;
  freeAndDecommitPages.data[4].word._4_4_ = pageCount;
  uVar4 = GetCountOfFreePages(this);
  if (uVar6 != uVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x192,"(freePageCount == (uint)this->GetCountOfFreePages())",
                       "freePageCount == (uint)this->GetCountOfFreePages()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  uVar6 = this->decommitPageCount;
  uVar4 = GetCountOfDecommitPages(this);
  if (uVar6 != uVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x193,"(decommitPageCount == (uint)this->GetCountOfDecommitPages())",
                       "decommitPageCount == (uint)this->GetCountOfDecommitPages()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (this->decommitPageCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x194,"(decommitPageCount != 0)","decommitPageCount != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (freeAndDecommitPages.data[4].word._4_4_ <= this->freePageCount + this->decommitPageCount) {
    if (((this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).secondaryAllocator !=
         (SecondaryAllocator *)0x0) &&
       (uVar5 = (*((this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                  secondaryAllocator)->_vptr_SecondaryAllocator[3])(), (uVar5 & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x199,
                         "(this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate())"
                         ,
                         "this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    memcpy(&index,&freePages,0x28);
    BVStatic<272UL>::Or((BVStatic<272UL> *)&index,&decommitPages);
    pages._4_4_ = this->freePageCount;
    pages._0_4_ = BVStatic<272UL>::GetNextBit((BVStatic<272UL> *)&index,0);
    while (uVar5 = (BVIndex)pages, (BVIndex)pages != 0xffffffff) {
      pPVar8 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAllocator
                         (&this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
      uVar6 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
              ::GetMaxAllocPageCount(pPVar8);
      if (uVar6 <= uVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x1a3,"(index < this->GetAllocator()->GetMaxAllocPageCount())",
                           "index < this->GetAllocator()->GetMaxAllocPageCount()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      uVar6 = GetAvailablePageCount(this);
      if (uVar6 - (BVIndex)pages < freeAndDecommitPages.data[4].word._4_4_) {
        return (char *)0x0;
      }
      if ((freeAndDecommitPages.data[4].word._4_4_ == 1) ||
         (BVar3 = BVStatic<272UL>::TestRange
                            ((BVStatic<272UL> *)&index,(BVIndex)pages,
                             freeAndDecommitPages.data[4].word._4_4_), BVar3 != '\0')) {
        pcStack_58 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address +
                     ((BVIndex)pages << 0xc);
        ret._4_4_ = 0;
        bVar2 = IsAllocationPageAligned
                          (pcStack_58,(ulong)freeAndDecommitPages.data[4].word._4_4_,
                           (uint *)((long)&ret + 4));
        if (bVar2) {
          pPVar8 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAllocator
                             (&this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
          this_00 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                    ::GetVirtualAllocator(pPVar8);
          pcVar9 = pcStack_58;
          pageCount_00 = (ulong)freeAndDecommitPages.data[4].word._4_4_;
          bVar2 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::IsInCustomHeapAllocator
                            (&this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
          pcVar9 = (char *)PreReservedVirtualAllocWrapper::AllocPages
                                     (this_00,pcVar9,pageCount_00,0x1000,4,bVar2);
          if (pcVar9 != (char *)0x0) {
            if (pcVar9 != pcStack_58) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                                 ,0x1be,"(ret == pages)","ret == pages");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            ClearRangeInFreePagesBitVector
                      (this,(BVIndex)pages,freeAndDecommitPages.data[4].word._4_4_);
            ClearRangeInDecommitPagesBitVector
                      (this,(BVIndex)pages,freeAndDecommitPages.data[4].word._4_4_);
            uVar6 = GetCountOfFreePages(this);
            this->freePageCount = (this->freePageCount - pages._4_4_) + uVar6;
            this->decommitPageCount =
                 this->decommitPageCount -
                 (freeAndDecommitPages.data[4].word._4_4_ - (pages._4_4_ - uVar6));
            uVar6 = this->freePageCount;
            uVar4 = GetCountOfFreePages(this);
            if (uVar6 != uVar4) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                                 ,0x1c7,"(freePageCount == (uint)this->GetCountOfFreePages())",
                                 "freePageCount == (uint)this->GetCountOfFreePages()");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            uVar6 = this->decommitPageCount;
            uVar4 = GetCountOfDecommitPages(this);
            if (uVar6 != uVar4) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                                 ,0x1c8,
                                 "(decommitPageCount == (uint)this->GetCountOfDecommitPages())",
                                 "decommitPageCount == (uint)this->GetCountOfDecommitPages()");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            return pcStack_58;
          }
          if (freeAndDecommitPages.data[4].word._4_4_ == 1) {
            return (char *)0x0;
          }
          goto LAB_00995421;
        }
        uVar5 = (BVIndex)pages + ret._4_4_;
        pPVar8 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAllocator
                           (&this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
        uVar6 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                ::GetMaxAllocPageCount(pPVar8);
        if (uVar6 <= uVar5) {
          return (char *)0x0;
        }
        pages._0_4_ = BVStatic<272UL>::GetNextBit
                                ((BVStatic<272UL> *)&index,(BVIndex)pages + ret._4_4_);
      }
      else {
LAB_00995421:
        pages._0_4_ = BVStatic<272UL>::GetNextBit((BVStatic<272UL> *)&index,(BVIndex)pages + 1);
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *
PageSegmentBase<TVirtualAlloc>::AllocDecommitPages(uint pageCount, T freePages, T decommitPages)
{
    Assert(freePageCount == (uint)this->GetCountOfFreePages());
    Assert(decommitPageCount ==  (uint)this->GetCountOfDecommitPages());
    Assert(decommitPageCount != 0);
    if (freePageCount + decommitPageCount < pageCount)
    {
        return nullptr;
    }
    Assert(this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate());

    T freeAndDecommitPages = freePages;

    freeAndDecommitPages.Or(&decommitPages);

    uint oldFreePageCount = freePageCount;
    uint index = freeAndDecommitPages.GetNextBit(0);
    while (index != -1)
    {
        Assert(index < this->GetAllocator()->GetMaxAllocPageCount());

        if (GetAvailablePageCount() - index < pageCount)
        {
            break;
        }
        if (pageCount == 1 || freeAndDecommitPages.TestRange(index, pageCount))
        {
            char * pages = this->address + index * AutoSystemInfo::PageSize;

            if (!notPageAligned)
            {
                uint nextIndex = 0;
                if (!IsAllocationPageAligned(pages, pageCount, &nextIndex))
                {
                    if (index + nextIndex >= this->GetAllocator()->GetMaxAllocPageCount())
                    {
                        return nullptr;
                    }
                    index = freeAndDecommitPages.GetNextBit(index + nextIndex);
                    continue;
                }
            }

            void * ret = this->GetAllocator()->GetVirtualAllocator()->AllocPages(pages, pageCount, MEM_COMMIT, PAGE_READWRITE, this->IsInCustomHeapAllocator());
            if (ret != nullptr)
            {
                Assert(ret == pages);

                this->ClearRangeInFreePagesBitVector(index, pageCount);
                this->ClearRangeInDecommitPagesBitVector(index, pageCount);

                uint newFreePageCount = this->GetCountOfFreePages();
                freePageCount = freePageCount - oldFreePageCount + newFreePageCount;
                decommitPageCount -= pageCount - (oldFreePageCount - newFreePageCount);

                Assert(freePageCount == (uint)this->GetCountOfFreePages());
                Assert(decommitPageCount == (uint)this->GetCountOfDecommitPages());

                return pages;
            }
            else if (pageCount == 1)
            {
                // if we failed to commit one page, we should just give up.
                return nullptr;
            }
        }
        index = freeAndDecommitPages.GetNextBit(index + 1);
    }

    return nullptr;
}